

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O2

void OpenSteer::OpenSteerDemo::initialize(void)

{
  ostream *poVar1;
  
  selectDefaultPlugIn();
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Known plugins:");
  std::endl<char,std::char_traits<char>>(poVar1);
  PlugIn::applyToAll(anon_unknown.dwarf_db2e::printPlugIn);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if (selectedPlugIn != (PlugIn *)0x0) {
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<(poVar1,"Default plugin:");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    poVar1 = operator<<(poVar1,selectedPlugIn);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    openSelectedPlugIn();
    return;
  }
  errorExit("no default PlugIn");
  PlugIn::sortBySelectionOrder();
  selectedPlugIn = PlugIn::findDefault();
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::initialize (void)
{
    // select the default PlugIn
    selectDefaultPlugIn ();

    {
        // XXX this block is for debugging purposes,
        // XXX should it be replaced with something permanent?

        std::cout << std::endl << "Known plugins:" << std::endl;   // xxx?
        PlugIn::applyToAll (printPlugIn);                          // xxx?
        std::cout << std::endl;                                    // xxx?

        // identify default PlugIn
        if (!selectedPlugIn) errorExit ("no default PlugIn");
        std::cout << std::endl << "Default plugin:" << std::endl;  // xxx?
        std::cout << " " << *selectedPlugIn << std::endl;          // xxx?
        std::cout << std::endl;                                    // xxx?
    }

    // initialize the default PlugIn
    openSelectedPlugIn ();
}